

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

void __thiscall ExecutorRegVm::Stop(ExecutorRegVm *this,NULLCRef error)

{
  char *dst;
  char *pcVar1;
  NULLCRef ptr;
  nullres nVar2;
  ExternTypeInfo *pEVar3;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar4;
  undefined4 uStack_44;
  undefined8 local_1c;
  undefined4 local_14;
  ExecutorRegVm *this_local;
  
  this->codeRunning = false;
  this->callContinue = false;
  dst = this->execErrorBuffer;
  pcVar1 = (this->exLinker->exSymbols).data;
  uVar4 = SUB84(pcVar1,0);
  uStack_44 = (undefined4)((ulong)pcVar1 >> 0x20);
  pEVar3 = FastVector<ExternTypeInfo,_false,_false>::operator[](this->exTypes,error.typeID);
  NULLC::SafeSprintf(dst,0x10000,"%s",CONCAT44(uStack_44,uVar4) + (ulong)pEVar3->offsetToName);
  this->execErrorMessage = this->execErrorBuffer;
  nVar2 = nullcIsStackPointer((void *)0x0);
  if (nVar2 == '\0') {
    this->execErrorObject = error;
    *(undefined4 *)((long)&(this->execErrorObject).ptr + 4) = error.ptr._4_4_;
  }
  else {
    ptr.ptr._0_4_ = in_stack_ffffffffffffffb4;
    ptr.typeID = error.ptr._4_4_;
    ptr.ptr._4_4_ = uVar4;
    NULLC::CopyObject(ptr);
    *(undefined8 *)&this->execErrorObject = local_1c;
    *(undefined4 *)((long)&(this->execErrorObject).ptr + 4) = local_14;
  }
  return;
}

Assistant:

void ExecutorRegVm::Stop(NULLCRef error)
{
	codeRunning = false;

	callContinue = false;

	NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "%s", exLinker->exSymbols.data + exTypes[error.typeID].offsetToName);

	execErrorMessage = execErrorBuffer;

	if(nullcIsStackPointer(error.ptr))
		execErrorObject = NULLC::CopyObject(error);
	else
		execErrorObject = error;
}